

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O0

void __thiscall AI::HierarchicalTaskNetworkComponent::sense(HierarchicalTaskNetworkComponent *this)

{
  HierarchicalTaskNetworkComponent *this_local;
  
  std::vector<AI::Stimulus,_std::allocator<AI::Stimulus>_>::clear
            (&(this->state).memory.sensoryMemory);
  incrementEngramAges(&(this->state).memory);
  pruneOldEngrams(&(this->state).memory);
  senseVisual(this);
  senseAuditory(this);
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::sense()
{
	state.memory.sensoryMemory.clear();

	incrementEngramAges(state.memory);
	pruneOldEngrams(state.memory);

	senseVisual();
	senseAuditory();
}